

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall
CMeshClosestPointMapper::TcSeamlessPatch::AddNextStepFi(TcSeamlessPatch *this,int fi)

{
  int iVar1;
  iterator __position;
  int *piVar2;
  bool bVar3;
  int local_4;
  
  piVar2 = (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar3 = piVar2 == __position._M_current;
  if (!bVar3) {
    iVar1 = *piVar2;
    while (iVar1 != fi) {
      piVar2 = piVar2 + 1;
      bVar3 = piVar2 == __position._M_current;
      if (bVar3) goto LAB_004ece5e;
      iVar1 = *piVar2;
    }
    if (!bVar3) {
      return;
    }
  }
LAB_004ece5e:
  if (__position._M_current ==
      (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_nextStepFis,__position,&local_4);
  }
  else {
    *__position._M_current = fi;
    (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void AddNextStepFi(int fi)
    {
      for (int nextStepFi : m_nextStepFis)
      {
        if (fi == nextStepFi)
          return;
      }
      m_nextStepFis.push_back(fi);
    }